

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

void __thiscall booster::locale::gnu_gettext::mo_file::load_file(mo_file *this,FILE *file)

{
  bool bVar1;
  ulong __n;
  size_t sVar2;
  runtime_error *prVar3;
  allocator local_49;
  string local_48;
  uint32_t magic;
  
  magic = 0;
  fread(&magic,4,1,(FILE *)file);
  bVar1 = true;
  if (magic != 0x950412de) {
    if (magic != 0xde120495) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_48,"Invalid file format",&local_49);
      runtime_error::runtime_error(prVar3,&local_48);
      __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    bVar1 = false;
  }
  this->native_byteorder_ = bVar1;
  fseek((FILE *)file,0,2);
  __n = ftell((FILE *)file);
  if (-1 < (long)__n) {
    fseek((FILE *)file,0,0);
    local_48._M_dataplus._M_p._0_1_ = 0;
    std::vector<char,_std::allocator<char>_>::resize(&this->vdata_,__n + 1,(value_type *)&local_48);
    sVar2 = fread((this->vdata_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,1,__n,(FILE *)file);
    if (sVar2 == (__n & 0xffffffff)) {
      this->data_ = (this->vdata_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      this->file_size_ = __n;
      return;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_48,"Failed to read file",&local_49);
    runtime_error::runtime_error(prVar3,&local_48);
    __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_48,"Wrong file object",&local_49);
  runtime_error::runtime_error(prVar3,&local_48);
  __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void load_file(FILE *file)
                {
                    uint32_t magic=0;
                    // if the size is wrong magic would be wrong
                    // ok to ingnore fread result
                    size_t four_bytes = fread(&magic,4,1,file);
                    (void)four_bytes; // shut GCC
                    
                    if(magic == 0x950412de)
                        native_byteorder_ = true;
                    else if(magic == 0xde120495)
                        native_byteorder_ = false;
                    else
                        throw booster::runtime_error("Invalid file format");
                    
                    fseek(file,0,SEEK_END);
                    long len=ftell(file);
                    if(len < 0) {
                        throw booster::runtime_error("Wrong file object");
                    }
                    fseek(file,0,SEEK_SET);
                    vdata_.resize(len+1,0); // +1 to make sure the vector is not empty
                    if(fread(&vdata_.front(),1,len,file)!=unsigned(len))
                        throw booster::runtime_error("Failed to read file");
                    data_ = &vdata_[0];
                    file_size_ = len;
                }